

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O3

void __thiscall
dap::BasicTypeInfo<dap::ModuleEvent>::copyConstruct
          (BasicTypeInfo<dap::ModuleEvent> *this,void *dst,void *src)

{
  Module::Module((Module *)dst,(Module *)src);
  *(long *)((long)dst + 0x150) = (long)dst + 0x160;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)dst + 0x150),*(long *)((long)src + 0x150),
             *(long *)((long)src + 0x158) + *(long *)((long)src + 0x150));
  return;
}

Assistant:

inline void copyConstruct(void* dst, const void* src) const override {
    new (dst) T(*reinterpret_cast<const T*>(src));
  }